

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

int SstFFSGetDeferred(SstStream Stream,void *Variable,char *Name,size_t DimCount,size_t *Start,
                     size_t *Count,void *Data)

{
  void *pvVar1;
  FFSVarRec_conflict pFVar2;
  undefined8 *puVar3;
  void *pvVar4;
  long in_RCX;
  undefined8 in_RDX;
  void *in_RSI;
  SstStream in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  FFSArrayRequest_conflict Req;
  void *IncomingDataBase;
  FFSVarRec_conflict Var;
  int GetFromWriter;
  FFSReaderMarshalBase *Info;
  uint local_4;
  
  pvVar1 = in_RDI->ReaderMarshalData;
  pFVar2 = LookupVarByKey(in_RDI,in_RSI);
  if (in_RCX != 0) {
    CP_verbose(in_RDI,TraceVerbose,"Get request, Name %s, Start %zu, Count %zu\n",in_RDX,*in_R8,
               *in_R9);
    puVar3 = (undefined8 *)malloc(0x38);
    *puVar3 = pFVar2;
    *(undefined4 *)(puVar3 + 1) = 0;
    pvVar4 = malloc(pFVar2->DimCount << 3);
    puVar3[3] = pvVar4;
    memcpy((void *)puVar3[3],in_R8,pFVar2->DimCount << 3);
    pvVar4 = malloc(pFVar2->DimCount << 3);
    puVar3[4] = pvVar4;
    memcpy((void *)puVar3[4],in_R9,pFVar2->DimCount << 3);
    puVar3[5] = Req;
    puVar3[6] = *(undefined8 *)((long)pvVar1 + 0x18);
    *(undefined8 **)((long)pvVar1 + 0x18) = puVar3;
  }
  else {
    memcpy(Req,(void *)(**(long **)((long)pvVar1 + 0x20) + *pFVar2->PerWriterMetaFieldOffset),
           (long)pFVar2->ElementSize);
  }
  local_4 = (uint)(in_RCX != 0);
  return local_4;
}

Assistant:

extern int SstFFSGetDeferred(SstStream Stream, void *Variable, const char *Name, size_t DimCount,
                             const size_t *Start, const size_t *Count, void *Data)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    int GetFromWriter = 0;
    FFSVarRec Var = LookupVarByKey(Stream, Variable);

    // if Variable is in Metadata (I.E. DimCount == 0), move incoming data to
    // Data area
    if (DimCount == 0)
    {
        void *IncomingDataBase = ((char *)Info->MetadataBaseAddrs[GetFromWriter]) +
                                 Var->PerWriterMetaFieldOffset[GetFromWriter];
        memcpy(Data, IncomingDataBase, Var->ElementSize);
        return 0; // No Sync needed
    }
    else
    {
        CP_verbose(Stream, TraceVerbose, "Get request, Name %s, Start %zu, Count %zu\n", Name,
                   Start[0], Count[0]);
        // Build request structure and enter it into requests list
        FFSArrayRequest Req = malloc(sizeof(*Req));
        Req->VarRec = Var;
        Req->RequestType = Global;
        // make a copy of Start and Count request
        Req->Start = malloc(sizeof(Start[0]) * Var->DimCount);
        memcpy(Req->Start, Start, sizeof(Start[0]) * Var->DimCount);
        Req->Count = malloc(sizeof(Count[0]) * Var->DimCount);
        memcpy(Req->Count, Count, sizeof(Count[0]) * Var->DimCount);
        Req->Data = Data;
        Req->Next = Info->PendingVarRequests;
        Info->PendingVarRequests = Req;
        return 1; // Later Sync needed
    }
}